

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O2

bool google::protobuf::util::ParseDelimitedFromZeroCopyStream
               (MessageLite *message,ZeroCopyInputStream *input,bool *clean_eof)

{
  bool bVar1;
  undefined1 local_70 [8];
  CodedInputStream coded_input;
  
  io::CodedInputStream::CodedInputStream((CodedInputStream *)local_70,input);
  bVar1 = ParseDelimitedFromCodedStream(message,(CodedInputStream *)local_70,clean_eof);
  io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_70);
  return bVar1;
}

Assistant:

bool ParseDelimitedFromZeroCopyStream(MessageLite* message,
                                      io::ZeroCopyInputStream* input,
                                      bool* clean_eof) {
  io::CodedInputStream coded_input(input);
  return ParseDelimitedFromCodedStream(message, &coded_input, clean_eof);
}